

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

fdb_status convert_errno_to_fdb_status(int errno_value,fdb_status default_status)

{
  if (errno_value < 0x4b) {
    switch(errno_value) {
    case 1:
      return FDB_RESULT_EPERM;
    case 2:
      return FDB_RESULT_NO_SUCH_FILE;
    case 5:
      return FDB_RESULT_EIO;
    case 6:
      return FDB_RESULT_ENXIO;
    case 9:
      return FDB_RESULT_EBADF;
    case 0xb:
      default_status = FDB_RESULT_EAGAIN;
      break;
    case 0xc:
      return FDB_RESULT_ENOMEM;
    case 0xd:
      return FDB_RESULT_EACCESS;
    case 0xe:
      return FDB_RESULT_EFAULT;
    case 0x11:
      return FDB_RESULT_EEXIST;
    case 0x13:
      return FDB_RESULT_ENODEV;
    case 0x14:
      return FDB_RESULT_ENOTDIR;
    case 0x15:
      return FDB_RESULT_EISDIR;
    case 0x16:
      return FDB_RESULT_EINVAL;
    case 0x17:
      return FDB_RESULT_ENFILE;
    case 0x18:
      return FDB_RESULT_EMFILE;
    case 0x1b:
      return FDB_RESULT_EFBIG;
    case 0x1c:
      return FDB_RESULT_ENOSPC;
    case 0x1e:
      return FDB_RESULT_EROFS;
    case 0x24:
      return FDB_RESULT_ENAMETOOLONG;
    case 0x28:
      return FDB_RESULT_ELOOP;
    }
  }
  else {
    if (errno_value == 0x4b) {
      return FDB_RESULT_EOVERFLOW;
    }
    if (errno_value == 0x5f) {
      return FDB_RESULT_EOPNOTSUPP;
    }
    if (errno_value == 0x69) {
      return FDB_RESULT_ENOBUFS;
    }
  }
  return default_status;
}

Assistant:

fdb_status convert_errno_to_fdb_status(int errno_value,
                                       fdb_status default_status)
{
    switch (errno_value) {
    case EACCES:
        return FDB_RESULT_EACCESS;
    case EEXIST:
        return FDB_RESULT_EEXIST;
    case EFAULT:
        return FDB_RESULT_EFAULT;
    case EFBIG:
        return FDB_RESULT_EFBIG;
    case EINVAL:
        return FDB_RESULT_EINVAL;
    case EISDIR:
        return FDB_RESULT_EISDIR;
    case ELOOP:
        return FDB_RESULT_ELOOP;
    case EMFILE:
        return FDB_RESULT_EMFILE;
    case ENAMETOOLONG:
        return FDB_RESULT_ENAMETOOLONG;
    case ENFILE:
        return FDB_RESULT_ENFILE;
    case ENODEV:
        return FDB_RESULT_ENODEV;
    case ENOENT:
        return FDB_RESULT_NO_SUCH_FILE;
    case ENOMEM:
        return FDB_RESULT_ENOMEM;
    case ENOSPC:
        return FDB_RESULT_ENOSPC;
    case ENOTDIR:
        return FDB_RESULT_ENOTDIR;
    case ENXIO:
        return FDB_RESULT_ENXIO;
    case EOPNOTSUPP:
        return FDB_RESULT_EOPNOTSUPP;
    case EOVERFLOW:
        return FDB_RESULT_EOVERFLOW;
    case EPERM:
        return FDB_RESULT_EPERM;
    case EROFS:
        return FDB_RESULT_EROFS;
    case EBADF:
        return FDB_RESULT_EBADF;
    case EIO:
        return FDB_RESULT_EIO;
    case ENOBUFS:
        return FDB_RESULT_ENOBUFS;
    case EAGAIN:
        return FDB_RESULT_EAGAIN;

    default:
        return default_status;
    }
}